

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZProjectEllipse.cpp
# Opt level: O2

bool __thiscall TPZProjectEllipse::AdjustingWithEllipse(TPZProjectEllipse *this)

{
  int iVar1;
  bool bVar2;
  long size;
  TPZManVector<double,_10> NewCoeffs;
  TPZManVector<double,_10> Ratios;
  TPZManVector<double,_10> Center;
  TPZManVector<double,_10> local_1e0;
  TPZManVector<double,_10> VectorK;
  TPZManVector<double,_10> VectorJ;
  TPZManVector<double,_10> VectorI;
  
  iVar1 = *(int *)(this + 0x10);
  size = (long)iVar1;
  Ratios.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_10>::TPZManVector(&Center,size,(double *)&Ratios);
  VectorI.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_10>::TPZManVector(&Ratios,size,(double *)&VectorI);
  VectorJ.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_10>::TPZManVector(&VectorI,size,(double *)&VectorJ);
  VectorK.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_10>::TPZManVector(&VectorJ,size,(double *)&VectorK);
  NewCoeffs.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_10>::TPZManVector(&VectorK,size,(double *)&NewCoeffs);
  bVar2 = LeastSquaresToGetEllipse(this);
  if (bVar2) {
    if ((iVar1 != 2) || (1e-12 <= ABS(*(double *)(*(long *)(this + 0xa0) + 0x10)))) {
      TPZManVector<double,_10>::TPZManVector(&NewCoeffs,0);
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/TPZProjectEllipse.cpp"
                 ,0x1af);
    }
    local_1e0.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
    TPZManVector<double,_10>::TPZManVector(&NewCoeffs,4,(double *)&local_1e0);
    TPZManVector<double,_10>::TPZManVector(&local_1e0,(TPZVec<double> *)(this + 0x98));
    TPZManVector<double,_10>::operator=(&NewCoeffs,&local_1e0);
    TPZManVector<double,_10>::~TPZManVector(&local_1e0);
    bVar2 = StandardFormatForSimpleEllipse
                      (this,&Center.super_TPZVec<double>,&Ratios.super_TPZVec<double>);
    if (bVar2) {
      PrintingAsSimpleEquation
                (this,&Center.super_TPZVec<double>,&Ratios.super_TPZVec<double>,
                 (ostream *)&std::cout);
    }
    TPZManVector<double,_10>::~TPZManVector(&NewCoeffs);
  }
  else {
    bVar2 = false;
  }
  TPZManVector<double,_10>::~TPZManVector(&VectorK);
  TPZManVector<double,_10>::~TPZManVector(&VectorJ);
  TPZManVector<double,_10>::~TPZManVector(&VectorI);
  TPZManVector<double,_10>::~TPZManVector(&Ratios);
  TPZManVector<double,_10>::~TPZManVector(&Center);
  return bVar2;
}

Assistant:

bool TPZProjectEllipse::AdjustingWithEllipse() {
    
    int dim = fPoints.Cols();
	TPZManVector<REAL> Center(dim,0.);
	TPZManVector<REAL> Ratios(dim,0.);
	TPZManVector<REAL> VectorI(dim,0.);
	TPZManVector<REAL> VectorJ(dim,0.);
	TPZManVector<REAL> VectorK(dim,0.);
	// Applying least squares for these five points
	if(!LeastSquaresToGetEllipse())
		return false;
    
	// In case a12 = 0, then don't exist rotation then it is a ellipse with parallel axes to cartesian axes
	if(dim==2 && IsZero(fcoefficients[2])) {
		TPZManVector<REAL> NewCoeffs(4,0.);
        NewCoeffs = fcoefficients;
		// Making zero depending on Tolerance
		float Tol;
		ZeroTolerance(Tol);
        
		// Getting the values of the center and ratios for the ellipse from Coeffs values
		if(!StandardFormatForSimpleEllipse(Center,Ratios))
			return false;
		PrintingAsSimpleEquation(Center,Ratios,std::cout);
		return true;
	}
    
	// Diagonalization of the quadratic form when Coeffs(2,0) is not null
	TPZManVector<REAL> NewCoeffs;
    DebugStop();
	//DiagonalizingQuadraticForm(NewCoeffs,std::cout);
    
	// The coefficients are multiplied by (-1/lambda2)
	if(dim==2) {
		fcoefficients[0] = -(NewCoeffs[0]/NewCoeffs[2]);
		fcoefficients[1] = -(NewCoeffs[1]/NewCoeffs[2]);
		fcoefficients[2] = -(NewCoeffs[3]/NewCoeffs[2]);
		fcoefficients[3] = -(NewCoeffs[4]/NewCoeffs[2]);
		// Getting the values of the center and ratios for the ellipse from Coeffs values
		if(!StandardFormatForSimpleEllipse(Center,Ratios))
			return false;
		PrintingAsSimpleEquation(Center,Ratios,std::cout);
	}
    
	return true;
}